

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O1

void __thiscall
HawkTracer::client::CallgrindConverter::~CallgrindConverter(CallgrindConverter *this)

{
  ~CallgrindConverter(this);
  operator_delete(this);
  return;
}

Assistant:

CallgrindConverter::~CallgrindConverter()
{
}